

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

PolynomialType * __thiscall
OpenMD::Polynomial<double>::operator*=(Polynomial<double> *this,double v)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict *pmVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color local_34;
  double local_30;
  mapped_type_conflict local_28;
  
  p_Var3 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    local_30 = v;
    do {
      local_34 = p_Var3[1]._M_color;
      local_28 = (double)p_Var3[1]._M_parent * local_30;
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->polyPairMap_,(key_type *)&local_34);
      *pmVar2 = local_28;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  return this;
}

Assistant:

PolynomialType& operator*=(const Real v) {
      typename Polynomial<Real>::const_iterator i;
      // Polynomial<Real> result;

      for (i = this->begin(); i != this->end(); ++i) {
        this->setCoefficient(i->first, i->second * v);
      }

      return *this;
    }